

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_new_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  int iVar1;
  lys_node *siblings;
  size_t sVar2;
  lyd_node *plVar3;
  LY_ERR *pLVar4;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (((parent != (lyd_node *)0x0 || module != (lys_module *)0x0) && name != (char *)0x0) &&
     (siblings = lyd_new_find_schema(parent,module,0), siblings != (lys_node *)0x0)) {
    sVar2 = strlen(name);
    iVar1 = lys_get_data_sibling(module,siblings,name,(int)sVar2,LYS_LEAFLIST|LYS_LEAF,&local_38);
    if (iVar1 == 0 && local_38 != (lys_node *)0x0) {
      plVar3 = _lyd_new_leaf(parent,local_38,val_str,0);
      return plVar3;
    }
  }
  pLVar4 = ly_errno_location();
  *pLVar4 = LY_EINVAL;
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_leaf(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *val_str)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 0);
    if (!siblings) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    if (lys_get_data_sibling(module, siblings, name, strlen(name), LYS_LEAFLIST | LYS_LEAF, &snode) || !snode) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    return _lyd_new_leaf(parent, snode, val_str, 0);
}